

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmalloc.c
# Opt level: O3

void * xmalloc(int size)

{
  void *__ptr;
  xmalloc_block *pxVar1;
  
  __ptr = malloc((long)size);
  if (__ptr != (void *)0x0) {
    pxVar1 = (xmalloc_block *)malloc(0x10);
    if (pxVar1 != (xmalloc_block *)0x0) {
      pxVar1->mem = __ptr;
      pxVar1->next = xm_blocklist;
      xm_blocklist = pxVar1;
      return __ptr;
    }
    free(__ptr);
  }
  return (void *)0x0;
}

Assistant:

void *xmalloc(int size)
{
    void *mem;
    struct xmalloc_block *b;
    
    mem = malloc(size);
    if (!mem)
	return NULL;
    
    b = malloc(sizeof(struct xmalloc_block));
    if (!b) {
	free(mem);
	return NULL;
    }
       
    b->mem = mem;
    b->next = xm_blocklist;
    xm_blocklist = b;
    
    return mem;
}